

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug-logger-winit.cpp
# Opt level: O3

void __thiscall
debug_logger_wrong_initialization::test_method(debug_logger_wrong_initialization *this)

{
  int iVar1;
  string *psVar2;
  long lVar3;
  CustomEntity *this_00;
  undefined8 **local_e8;
  undefined1 local_e0;
  undefined8 *local_d8;
  char **local_d0;
  undefined8 **local_c8;
  undefined1 local_c0;
  undefined8 *local_b8;
  undefined1 **local_b0;
  char *local_a8;
  undefined1 *local_a0;
  undefined1 local_98 [8];
  undefined8 local_90;
  shared_count sStack_88;
  undefined1 *local_80;
  undefined1 *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined **local_50;
  undefined1 local_48;
  undefined8 *local_40;
  char *local_38;
  
  dynamicgraph::RealTimeLogger::instance();
  local_70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/debug-logger-winit.cpp"
  ;
  local_68 = "";
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_70,0x46);
  local_48 = 0;
  local_50 = &PTR__lazy_ostream_00108c78;
  local_40 = &boost::unit_test::lazy_ostream::inst;
  local_38 = "";
  iVar1 = std::__cxx11::string::compare(dynamicgraph::CustomEntity::CLASS_NAME_abi_cxx11_);
  local_98[0] = iVar1 == 0;
  local_90 = 0;
  sStack_88.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/debug-logger-winit.cpp"
  ;
  local_58 = "";
  local_b0 = &local_a0;
  local_a0 = dynamicgraph::CustomEntity::CLASS_NAME_abi_cxx11_;
  local_c0 = 0;
  local_c8 = (undefined8 **)&PTR__lazy_ostream_00108cb8;
  local_b8 = &boost::unit_test::lazy_ostream::inst;
  local_d0 = &local_a8;
  local_a8 = "CustomEntity";
  local_e0 = 0;
  local_e8 = (undefined8 **)&PTR__lazy_ostream_00108cf8;
  local_d8 = &boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (local_98,&local_50,&local_60,0x46,1,2,2,"dynamicgraph::CustomEntity::CLASS_NAME",
             &local_c8,"\"CustomEntity\"",&local_e8);
  boost::detail::shared_count::~shared_count(&sStack_88);
  psVar2 = (string *)dynamicgraph::FactoryStorage::getInstance();
  local_c8 = &local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"CustomEntity","");
  local_e8 = &local_d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"my-entity-2","");
  lVar3 = dynamicgraph::FactoryStorage::newEntity(psVar2,(string *)&local_c8);
  if (lVar3 == 0) {
    this_00 = (CustomEntity *)0x0;
  }
  else {
    this_00 = (CustomEntity *)
              __dynamic_cast(lVar3,&dynamicgraph::Entity::typeinfo,
                             &dynamicgraph::CustomEntity::typeinfo,0);
  }
  if (local_e8 != &local_d8) {
    operator_delete(local_e8,(long)local_d8 + 1);
  }
  if (local_c8 != &local_b8) {
    operator_delete(local_c8,(long)local_b8 + 1);
  }
  iVar1 = 1000;
  do {
    dynamicgraph::CustomEntity::testDebugTrace(this_00);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  dynamicgraph::RealTimeLogger::destroy();
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(debug_logger_wrong_initialization) {
  dynamicgraph::RealTimeLogger::instance();

  BOOST_CHECK_EQUAL(dynamicgraph::CustomEntity::CLASS_NAME, "CustomEntity");

  dynamicgraph::CustomEntity &entity =
      *(dynamic_cast<dynamicgraph::CustomEntity *>(
          dynamicgraph::FactoryStorage::getInstance()->newEntity(
              "CustomEntity", "my-entity-2")));

  for (unsigned int i = 0; i < 1000; i++) {
    entity.testDebugTrace();
  }

  dynamicgraph::RealTimeLogger::destroy();
}